

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_block_manager.hpp
# Opt level: O0

idx_t __thiscall duckdb::InMemoryBlockManager::TotalBlocks(InMemoryBlockManager *this)

{
  InternalException *this_00;
  string *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [40];
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_28,"Cannot perform IO in in-memory database - TotalBlocks!",&local_29);
  InternalException::InternalException(this_00,in_stack_ffffffffffffffa8);
  __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

idx_t TotalBlocks() override {
		throw InternalException("Cannot perform IO in in-memory database - TotalBlocks!");
	}